

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O3

void fstk_Init(char *mainPath,size_t maxDepth)

{
  bool bVar1;
  uint32_t uVar2;
  LexerState *pLVar3;
  char *pcVar4;
  size_t sVar5;
  Context *pCVar6;
  FileStackNode *pFVar7;
  char *pcVar8;
  int *piVar9;
  char *fullPath;
  char *local_40;
  size_t local_38;
  
  pLVar3 = lexer_OpenFile(mainPath);
  if (pLVar3 == (LexerState *)0x0) {
    pcVar4 = "Failed to open main file\n";
LAB_0010c66e:
    fatalerror(pcVar4);
  }
  lexerState = pLVar3;
  pcVar4 = lexer_GetFileName();
  sVar5 = strlen(pcVar4);
  pCVar6 = (Context *)malloc(0x40);
  pFVar7 = (FileStackNode *)malloc(sVar5 + 0x29);
  if (pCVar6 == (Context *)0x0) {
    piVar9 = __errno_location();
    pcVar4 = strerror(*piVar9);
    pcVar8 = "Failed to allocate memory for main context: %s\n";
  }
  else {
    if (pFVar7 != (FileStackNode *)0x0) {
      pCVar6->fileInfo = pFVar7;
      pFVar7->parent = (FileStackNode *)0x0;
      pFVar7->lineNo = 0;
      pFVar7->referenced = false;
      pFVar7->type = NODE_FILE;
      memcpy(pFVar7 + 1,pcVar4,sVar5 + 1);
      pCVar6->parent = (Context *)0x0;
      pCVar6->lexerState = pLVar3;
      uVar2 = macro_UndefUniqueID();
      pCVar6->uniqueID = uVar2;
      pCVar6->nbReptIters = 0;
      pCVar6->forValue = 0;
      pCVar6->forStep = 0;
      pCVar6->forName = (char *)0x0;
      contextStack = pCVar6;
      if (0x3ffffffffffffff3 < maxDepth) {
        error("Recursion depth may not be higher than %zu, defaulting to 64\n");
        maxDepth = 0x40;
      }
      maxRecursionDepth = maxDepth;
      if (preIncludeName != (char *)0x0) {
        local_40 = (char *)0x0;
        local_38 = 0;
        bVar1 = fstk_FindFile(preIncludeName,&local_40,&local_38);
        if (bVar1) {
          pFVar7 = (FileStackNode *)malloc(local_38 + 0x28);
          pcVar4 = local_40;
          if (pFVar7 == (FileStackNode *)0x0) {
            piVar9 = __errno_location();
            pcVar4 = strerror(*piVar9);
            error("Failed to alloc file info for pre-include: %s\n",pcVar4);
          }
          else {
            pFVar7->type = NODE_FILE;
            strcpy((char *)(pFVar7 + 1),local_40);
            free(pcVar4);
            newContext(pFVar7);
            pLVar3 = lexer_OpenFile((char *)(pFVar7 + 1));
            contextStack->lexerState = pLVar3;
            if (pLVar3 == (LexerState *)0x0) {
              pcVar4 = "Failed to set up lexer for file include\n";
              goto LAB_0010c66e;
            }
            lexerState = pLVar3;
            uVar2 = macro_UndefUniqueID();
            contextStack->uniqueID = uVar2;
          }
        }
        else {
          free(local_40);
          pcVar4 = preIncludeName;
          piVar9 = __errno_location();
          pcVar8 = strerror(*piVar9);
          error("Unable to open included file \'%s\': %s\n",pcVar4,pcVar8);
        }
      }
      return;
    }
    piVar9 = __errno_location();
    pcVar4 = strerror(*piVar9);
    pcVar8 = "Failed to allocate memory for main file info: %s\n";
  }
  fatalerror(pcVar8,pcVar4);
}

Assistant:

void fstk_Init(char const *mainPath, size_t maxDepth)
{
	struct LexerState *state = lexer_OpenFile(mainPath);

	if (!state)
		fatalerror("Failed to open main file\n");
	lexer_SetState(state);
	char const *fileName = lexer_GetFileName();
	size_t len = strlen(fileName);
	struct Context *context = (struct Context *)malloc(sizeof(*contextStack));
	struct FileStackNamedNode *fileInfo =
		(struct FileStackNamedNode *)malloc(sizeof(*fileInfo) + len + 1);

	if (!context)
		fatalerror("Failed to allocate memory for main context: %s\n", strerror(errno));
	if (!fileInfo)
		fatalerror("Failed to allocate memory for main file info: %s\n", strerror(errno));

	context->fileInfo = (struct FileStackNode *)fileInfo;
	// lineNo and reptIter are unused on the top-level context
	context->fileInfo->parent = NULL;
	context->fileInfo->lineNo = 0; // This still gets written to the object file, so init it
	context->fileInfo->referenced = false;
	context->fileInfo->type = NODE_FILE;
	memcpy(fileInfo->name, fileName, len + 1);

	context->parent = NULL;
	context->lexerState = state;
	context->uniqueID = macro_UndefUniqueID();
	context->nbReptIters = 0;
	context->forValue = 0;
	context->forStep = 0;
	context->forName = NULL;

	// Now that it's set up properly, register the context
	contextStack = context;

	// Check that max recursion depth won't allow overflowing node `malloc`s
	// This assumes that the rept node is larger
#define DEPTH_LIMIT ((SIZE_MAX - sizeof(struct FileStackReptNode)) / sizeof(uint32_t))
	if (maxDepth > DEPTH_LIMIT) {
		error("Recursion depth may not be higher than %zu, defaulting to "
		      EXPAND_AND_STR(DEFAULT_MAX_DEPTH) "\n", DEPTH_LIMIT);
		maxRecursionDepth = DEFAULT_MAX_DEPTH;
	} else {
		maxRecursionDepth = maxDepth;
	}
	// Make sure that the default of 64 is OK, though
	assert(DEPTH_LIMIT >= DEFAULT_MAX_DEPTH);
#undef DEPTH_LIMIT

	runPreIncludeFile();
}